

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

local_date_format_info * __thiscall
toml::basic_value<toml::type_config>::as_local_date_fmt(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == local_date) {
    return (local_date_format_info *)((long)&this->field_1 + 4);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_local_date_fmt()","");
  throw_bad_cast(this,&local_38,local_date);
}

Assistant:

local_date_format_info const& as_local_date_fmt() const
    {
        if(this->type_ != value_t::local_date)
        {
            this->throw_bad_cast("toml::value::as_local_date_fmt()", value_t::local_date);
        }
        return this->local_date_.format;
    }